

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

intrusive_ptr<cppcms::impl::base_cache> cppcms::impl::thread_cache_factory(uint items)

{
  base_cache *p;
  undefined4 in_ESI;
  base_cache *in_RDI;
  uint in_stack_0000001c;
  mem_cache<cppcms::impl::thread_settings> *in_stack_00000020;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  p = (base_cache *)
      mem_cache<cppcms::impl::thread_settings>::operator_new
                (CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  mem_cache<cppcms::impl::thread_settings>::mem_cache(in_stack_00000020,in_stack_0000001c);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return (intrusive_ptr<cppcms::impl::base_cache>)in_RDI;
}

Assistant:

booster::intrusive_ptr<base_cache> thread_cache_factory(unsigned items)
{
	return new mem_cache<thread_settings>(items);
}